

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileImporter::~Q3BSPFileImporter(Q3BSPFileImporter *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  pointer ppaVar3;
  _Rb_tree_node_base *p_Var4;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0089ee98;
  this->m_pCurrentMesh = (aiMesh *)0x0;
  this->m_pCurrentFace = (aiFace *)0x0;
  for (p_Var4 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1]._M_parent != (_Base_ptr)0x0) {
      puVar1 = *(undefined8 **)(p_Var4 + 2);
      if ((puVar1 != (undefined8 *)0x0) && (pvVar2 = (void *)*puVar1, pvVar2 != (void *)0x0)) {
        operator_delete(pvVar2,puVar1[2] - (long)pvVar2);
      }
      operator_delete(puVar1,0x18);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
  ::clear(&(this->m_MaterialLookupMap)._M_t);
  ppaVar3 = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar3 != (pointer)0x0) {
    operator_delete(ppaVar3,(long)(this->mTextures).
                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar3)
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
  ::~_Rb_tree(&(this->m_MaterialLookupMap)._M_t);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

Q3BSPFileImporter::~Q3BSPFileImporter() {
    m_pCurrentMesh = nullptr;
    m_pCurrentFace = nullptr;

    // Clear face-to-material map
    for ( FaceMap::iterator it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        const std::string &matName = it->first;
        if ( !matName.empty() ) {
            delete it->second;
        }
    }
    m_MaterialLookupMap.clear();
}